

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  DebugMLTSampler *this_00;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  Float FVar11;
  undefined8 uVar13;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar25 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [64];
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [56];
  Float f_1;
  float fVar31;
  Vector3f woRender;
  SampledSpectrum SVar32;
  Vector3f wiRender;
  Vector3f wiRender_00;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum f;
  LightLiSample ls;
  DispatchSplit<9> local_1f9;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  BSDF *local_1c8;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [16];
  Interval<float> local_198;
  Interval<float> IStack_190;
  Interval<float> IStack_188;
  undefined8 uStack_180;
  float local_178;
  undefined8 local_174;
  float local_16c;
  Interval<float> local_168;
  Interval<float> IStack_160;
  Interval<float> IStack_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  undefined4 local_12c;
  Interval<float> *local_128;
  undefined8 *puStack_120;
  undefined8 *puStack_118;
  undefined4 *puStack_110;
  undefined1 local_108 [44];
  float local_dc;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  anon_struct_8_0_00000001_for___align local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar16 [64];
  undefined1 auVar23 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar29 [64];
  
  local_1a8._8_8_ = local_1a8._0_8_;
  auVar14 = in_ZMM1._0_16_;
  local_108._16_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  local_1f8._8_8_ = local_1f8._0_8_;
  local_1f8._0_8_ = lambda;
  local_108._0_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  local_108._8_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  local_108._24_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_108._28_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_108._32_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_108._36_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_108._40_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_dc = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_168 = (Interval<float>)
              (sampler->
              super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
  local_1c8 = bsdf;
  FVar11 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)&local_128,&local_168,(ulong)local_168 >> 0x30);
  uVar8 = (this->lightSampler).
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits;
  local_1a8._0_8_ = this;
  if ((ushort)(uVar8 >> 0x30) < 3) {
    if ((uVar8 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_1e8,
                 (PowerLightSampler *)(uVar8 & 0xffffffffffff),FVar11);
    }
    else {
      lVar3 = *(long *)((uVar8 & 0xffffffffffff) + 0x18);
      if (lVar3 == 0) {
        local_1e8._0_12_ = ZEXT412(0);
        local_1e8._12_4_ = 0;
        local_1d8._0_1_ = false;
        local_1d8._1_7_ = 0;
        bVar5 = false;
      }
      else {
        auVar14 = vcvtusi2ss_avx512f(auVar14,lVar3);
        iVar7 = (int)lVar3 + -1;
        iVar9 = (int)(FVar11 * auVar14._0_4_);
        if (iVar9 <= iVar7) {
          iVar7 = iVar9;
        }
        bVar5 = true;
        local_1e8._8_4_ = 1.0 / auVar14._0_4_;
        local_1e8._0_8_ = *(undefined8 *)(*(long *)((uVar8 & 0xffffffffffff) + 8) + (long)iVar7 * 8)
        ;
      }
      local_1d8._0_1_ = bVar5;
    }
  }
  else if ((uVar8 & 0xfffe000000000000) == 0x2000000000000) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1e8,(BVHLightSampler *)(uVar8 & 0xffffffffffff)
               ,(LightSampleContext *)local_108,FVar11);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1e8,
               (ExhaustiveLightSampler *)(uVar8 & 0xffffffffffff),(LightSampleContext *)local_108,
               FVar11);
  }
  uVar8 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  uVar6 = (uint)(ushort)(uVar8 >> 0x30);
  if (uVar8 >> 0x30 < 5) {
    if (uVar8 < 0x3000000000000) {
      if (uVar6 == 2) {
        auVar16._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar8 & 0xffffffffffff));
        auVar16._8_56_ = extraout_var_00;
        auVar14 = auVar16._0_16_;
      }
      else {
        auVar20._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar8 & 0xffffffffffff));
        auVar20._8_56_ = extraout_var_04;
        auVar14 = auVar20._0_16_;
      }
    }
    else if ((uVar6 & 6) == 2) {
      auVar18._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar8 & 0xffffffffffff));
      auVar18._8_56_ = extraout_var_02;
      auVar14 = auVar18._0_16_;
    }
    else {
      auVar22._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar8 & 0xffffffffffff));
      auVar22._8_56_ = extraout_var_06;
      auVar14 = auVar22._0_16_;
    }
  }
  else {
    uVar6 = uVar6 - 4;
    if (uVar6 < 3) {
      if (uVar6 == 2) {
        auVar17._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar8 & 0xffffffffffff));
        auVar17._8_56_ = extraout_var_01;
        auVar14 = auVar17._0_16_;
      }
      else {
        auVar21._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar8 & 0xffffffffffff));
        auVar21._8_56_ = extraout_var_05;
        auVar14 = auVar21._0_16_;
      }
    }
    else {
      this_00 = (DebugMLTSampler *)(uVar8 & 0xffffffffffff);
      if ((uVar6 & 0x7ffffffe) == 2) {
        auVar19._0_8_ = MLTSampler::Get2D((MLTSampler *)this_00);
        auVar19._8_56_ = extraout_var_03;
        auVar14 = auVar19._0_16_;
      }
      else {
        local_1b8 = DebugMLTSampler::Get1D(this_00);
        uStack_1b4 = extraout_XMM0_Db;
        uStack_1b0 = extraout_XMM0_Dc;
        uStack_1ac = extraout_XMM0_Dd;
        auVar24._0_4_ = DebugMLTSampler::Get1D(this_00);
        auVar24._4_60_ = extraout_var;
        auVar14._4_4_ = uStack_1b4;
        auVar14._0_4_ = local_1b8;
        auVar14._8_4_ = uStack_1b0;
        auVar14._12_4_ = uStack_1ac;
        auVar14 = vinsertps_avx(auVar14,auVar24._0_16_,0x10);
      }
    }
  }
  uVar13 = 0;
  uVar26 = 0;
  if (local_1d8._0_1_ == true) {
    IStack_188 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    uVar4 = local_1e8._0_8_;
    local_128 = &local_168;
    local_198 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    IStack_190 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    uStack_180._0_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uStack_180._4_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    puStack_110 = &local_12c;
    local_178 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_174._0_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_174._4_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_16c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_58 = *(undefined8 *)local_1f8._0_8_;
    uStack_50 = *(undefined8 *)(local_1f8._0_8_ + 8);
    uStack_48 = *(undefined8 *)(local_1f8._0_8_ + 0x10);
    uStack_40 = *(undefined8 *)(local_1f8._0_8_ + 0x18);
    puStack_118 = &local_58;
    local_12c = 0;
    puStack_120 = &local_68;
    local_68 = vmovlps_avx(auVar14);
    local_60 = (anon_struct_8_0_00000001_for___align)local_1e8._0_8_;
    local_168 = local_198;
    IStack_160 = IStack_190;
    IStack_158 = IStack_188;
    uStack_150 = uStack_180;
    local_148 = local_178;
    local_144 = local_174;
    local_13c = local_16c;
    detail::DispatchSplit<9>::operator()
              ((LightSampleContext *)local_108,&local_1f9,&local_60,(ulong)local_1e8._0_8_ >> 0x30);
    uVar13 = 0;
    if ((float)local_108._28_4_ <= 0.0) {
LAB_0042debe:
      uVar13 = 0;
      uVar26 = 0;
    }
    else {
      if (((float)local_108._0_4_ == 0.0) && (!NAN((float)local_108._0_4_))) {
        uVar8 = 0xffffffffffffffff;
        do {
          if (uVar8 == 2) goto LAB_0042debe;
          fVar12 = *(float *)((long)&((LightSampleContext *)local_108)->pi + uVar8 * 4 + 8);
          uVar8 = uVar8 + 1;
        } while ((fVar12 == 0.0) && (!NAN(fVar12)));
        uVar26 = 0;
        if (2 < uVar8) goto LAB_0042dec2;
      }
      local_1f8._8_8_ = 0;
      local_1f8._0_8_ = local_108._16_8_;
      pVVar1 = &(intr->super_Interaction).wo;
      local_88._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      local_88._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_1bc = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_78 = vmovshdup_avx(local_1f8);
      uStack_80 = 0;
      local_1b8 = (float)local_108._24_4_;
      auVar30 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar25 = ZEXT856(0);
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_108._24_4_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._16_4_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._20_4_;
      SVar32 = BSDF::f(local_1c8,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,
                       Radiance);
      auVar29._0_8_ = SVar32.values.values._8_8_;
      auVar29._8_56_ = auVar30;
      auVar23._0_8_ = SVar32.values.values._0_8_;
      auVar23._8_56_ = auVar25;
      fVar12 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar14 = vmovlhps_avx(auVar23._0_16_,auVar29._0_16_);
      auVar27 = ZEXT416((uint)(local_1b8 * fVar12));
      auVar10 = vfmadd132ss_fma(local_78,auVar27,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar27 = vfmsub213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)local_1b8),auVar27);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ + auVar27._0_4_)),local_1f8,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar27._0_4_ = auVar10._0_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(auVar27,auVar10);
      local_168.low = auVar10._0_4_ * auVar14._0_4_;
      local_168.high = auVar10._4_4_ * auVar14._4_4_;
      IStack_160.low = auVar10._8_4_ * auVar14._8_4_;
      IStack_160.high = auVar10._12_4_ * auVar14._12_4_;
      if ((local_168.low == 0.0) && (!NAN(local_168.low))) {
        uVar8 = 0xffffffffffffffff;
        uVar13 = 0;
        do {
          if (uVar8 == 2) goto LAB_0042debe;
          pfVar2 = &IStack_160.low + uVar8;
          uVar8 = uVar8 + 1;
        } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
        uVar26 = 0;
        if (2 < uVar8) goto LAB_0042dec2;
      }
      bVar5 = Integrator::Unoccluded
                        ((Integrator *)local_1a8._0_8_,&intr->super_Interaction,
                         (Interaction *)((long)&((LightSampleContext *)local_108)->ns + 4));
      auVar14 = local_1f8;
      uVar13 = 0;
      uVar26 = 0;
      if (bVar5) {
        if (local_1d8._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        fVar12 = (float)local_1e8._8_4_ * (float)local_108._28_4_;
        if (*(uint *)(uVar4 & 0xffffffffffff) < 2) {
          auVar28._4_4_ = fVar12;
          auVar28._0_4_ = fVar12;
          auVar28._8_4_ = fVar12;
          auVar28._12_4_ = fVar12;
          auVar15._0_4_ = (float)local_108._0_4_ * local_168.low;
          auVar15._4_4_ = (float)local_108._4_4_ * local_168.high;
          auVar15._8_4_ = (float)local_108._8_4_ * IStack_160.low;
          auVar15._12_4_ = (float)local_108._12_4_ * IStack_160.high;
        }
        else {
          local_1a8 = ZEXT416((uint)fVar12);
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_1bc;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_88;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_88._4_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_1b8;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
          local_1f8 = auVar14;
          FVar11 = BSDF::PDF(local_1c8,woRender,wiRender_00,Radiance,All);
          if (SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
              ::reg == '\0') {
            local_1f8._0_4_ = FVar11;
            iVar7 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                         ::reg);
            FVar11 = (Float)local_1f8._0_4_;
            if (iVar7 != 0) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                          ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                ::StatsAccumulator__,(PixelAccumFunc)0x0);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                   ::reg);
              FVar11 = (Float)local_1f8._0_4_;
            }
          }
          *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
          if (((FVar11 == 0.0) && (!NAN(FVar11))) &&
             (1 < *(ushort *)
                   ((long)&(local_1c8->bxdf).
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits + 6) - 3)) {
            *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
          }
          fVar31 = local_1a8._0_4_;
          auVar14 = vfmadd231ss_fma(ZEXT416((uint)(FVar11 * FVar11)),local_1a8,local_1a8);
          fVar12 = (fVar31 * fVar31) / auVar14._0_4_;
          auVar15._0_4_ = fVar12 * (float)local_108._0_4_ * local_168.low;
          auVar15._4_4_ = fVar12 * (float)local_108._4_4_ * local_168.high;
          auVar15._8_4_ = fVar12 * (float)local_108._8_4_ * IStack_160.low;
          auVar15._12_4_ = fVar12 * (float)local_108._12_4_ * IStack_160.high;
          auVar28._4_4_ = fVar31;
          auVar28._0_4_ = fVar31;
          auVar28._8_4_ = fVar31;
          auVar28._12_4_ = fVar31;
        }
        auVar14 = vdivps_avx(auVar15,auVar28);
        uVar13 = auVar14._0_8_;
        auVar14 = vshufpd_avx(auVar14,auVar14,1);
        uVar26 = auVar14._0_8_;
      }
    }
  }
LAB_0042dec2:
  SVar32.values.values[2] = (float)(int)uVar26;
  SVar32.values.values[3] = (float)(int)((ulong)uVar26 >> 0x20);
  SVar32.values.values[0] = (float)(int)uVar13;
  SVar32.values.values[1] = (float)(int)((ulong)uVar13 >> 0x20);
  return (SampledSpectrum)SVar32.values.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);

    // Sample a point on the light source for direct lighting
    LightLiSample ls = light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls.wi;
    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls.pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls.pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls.L / lightPDF;
    else {
        Float bsdfPDF = bsdf.PDF(wo, wi);
        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false && bsdfPDF == 0);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls.L * weight / lightPDF;
    }
}